

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleValueHashTableOf.hpp
# Opt level: O0

void __thiscall
SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::removeAll
          (SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *this)

{
  ValueHashTableBucketElem<unsigned_int> *pVVar1;
  ValueHashTableBucketElem<unsigned_int> *nextElem;
  ValueHashTableBucketElem<unsigned_int> *curElem;
  XMLSize_t buckInd;
  SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *this_local;
  
  for (curElem = (ValueHashTableBucketElem<unsigned_int> *)0x0;
      curElem < (ValueHashTableBucketElem<unsigned_int> *)this->fHashModulus;
      curElem = (ValueHashTableBucketElem<unsigned_int> *)((long)&curElem->fData + 1)) {
    pVVar1 = this->fBucketList[(long)curElem];
    while (nextElem = pVVar1, nextElem != (ValueHashTableBucketElem<unsigned_int> *)0x0) {
      pVVar1 = nextElem->fNext;
      if (nextElem != (ValueHashTableBucketElem<unsigned_int> *)0x0) {
        operator_delete(nextElem,0x18);
      }
    }
    this->fBucketList[(long)curElem] = (ValueHashTableBucketElem<unsigned_int> *)0x0;
  }
  return;
}

Assistant:

void SimpleValueHashTableOf<TVal, THasher>::removeAll()
{
    // Clean up the buckets first
    for (XMLSize_t buckInd = 0; buckInd < fHashModulus; buckInd++)
    {
        // Get the bucket list head for this entry
        ValueHashTableBucketElem<TVal>* curElem = fBucketList[buckInd];
        ValueHashTableBucketElem<TVal>* nextElem;
        while (curElem)
        {
            // Save the next element before we hose this one
            nextElem = curElem->fNext;

            // delete the current element and move forward
            delete curElem;
            curElem = nextElem;
        }

        // Clean out this entry
        fBucketList[buckInd] = 0;
    }
}